

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dh.cc
# Opt level: O1

int pkey_dh_derive(EVP_PKEY_CTX *ctx,uint8_t *out,size_t *out_len)

{
  DH *dh;
  DH *dh_00;
  int *piVar1;
  int iVar2;
  uint uVar3;
  BIGNUM *pub_key;
  ulong uVar4;
  int line;
  
  if ((ctx->pkey == (EVP_PKEY *)0x0) || (ctx->peerkey == (EVP_PKEY *)0x0)) {
    iVar2 = 0x75;
    line = 0x4c;
  }
  else {
    dh = (DH *)ctx->pkey->pkey;
    dh_00 = (DH *)ctx->peerkey->pkey;
    if (dh_00 == (DH *)0x0 || dh == (DH *)0x0) {
      iVar2 = 0x75;
      line = 0x53;
    }
    else {
      piVar1 = (int *)ctx->data;
      pub_key = (BIGNUM *)DH_get0_pub_key(dh_00);
      if (pub_key != (BIGNUM *)0x0) {
        if (out == (uint8_t *)0x0) {
          iVar2 = DH_size(dh);
          uVar4 = (ulong)iVar2;
        }
        else {
          uVar4 = *out_len;
          iVar2 = DH_size(dh);
          if (uVar4 < (ulong)(long)iVar2) {
            iVar2 = 100;
            line = 99;
            goto LAB_00212e53;
          }
          if (*piVar1 == 0) {
            uVar3 = DH_compute_key(out,pub_key,dh);
          }
          else {
            uVar3 = DH_compute_key_padded(out,pub_key,dh);
          }
          if ((int)uVar3 < 0) {
            return 0;
          }
          iVar2 = DH_size(dh);
          if (iVar2 < (int)uVar3) {
            __assert_fail("ret <= DH_size(our_key)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dh.cc"
                          ,0x6d,"int pkey_dh_derive(EVP_PKEY_CTX *, uint8_t *, size_t *)");
          }
          uVar4 = (ulong)uVar3;
        }
        *out_len = uVar4;
        return 1;
      }
      iVar2 = 0x75;
      line = 0x59;
    }
  }
LAB_00212e53:
  ERR_put_error(6,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dh.cc"
                ,line);
  return 0;
}

Assistant:

static int pkey_dh_derive(EVP_PKEY_CTX *ctx, uint8_t *out, size_t *out_len) {
  DH_PKEY_CTX *dctx = reinterpret_cast<DH_PKEY_CTX *>(ctx->data);
  if (ctx->pkey == NULL || ctx->peerkey == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_KEYS_NOT_SET);
    return 0;
  }

  DH *our_key = reinterpret_cast<DH *>(ctx->pkey->pkey);
  DH *peer_key = reinterpret_cast<DH *>(ctx->peerkey->pkey);
  if (our_key == NULL || peer_key == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_KEYS_NOT_SET);
    return 0;
  }

  const BIGNUM *pub_key = DH_get0_pub_key(peer_key);
  if (pub_key == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_KEYS_NOT_SET);
    return 0;
  }

  if (out == NULL) {
    *out_len = DH_size(our_key);
    return 1;
  }

  if (*out_len < (size_t)DH_size(our_key)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_BUFFER_TOO_SMALL);
    return 0;
  }

  int ret = dctx->pad ? DH_compute_key_padded(out, pub_key, our_key)
                      : DH_compute_key(out, pub_key, our_key);
  if (ret < 0) {
    return 0;
  }

  assert(ret <= DH_size(our_key));
  *out_len = (size_t)ret;
  return 1;
}